

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.cpp
# Opt level: O2

void Diligent::CopyBLASGeometryDesc
               (BottomLevelASDesc *SrcDesc,BottomLevelASDesc *DstDesc,FixedLinearAllocator *MemPool,
               BLASNameToIndex *pSrcNameToIndex,BLASNameToIndex *DstNameToIndex)

{
  uint uVar1;
  BLASTriangleDesc *pBVar2;
  const_iterator cVar3;
  BLASBoundingBoxDesc *pBVar4;
  char (*pacVar5) [31];
  long lVar6;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var7;
  Uint32 i_1;
  Uint32 i;
  ulong uVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>,_bool>
  pVar9;
  char *GeoName;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_68;
  BottomLevelASDesc *local_60;
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_58;
  string msg;
  
  local_68 = &pSrcNameToIndex->_M_h;
  local_60 = DstDesc;
  local_58 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)DstNameToIndex;
  if (SrcDesc->pTriangles == (BLASTriangleDesc *)0x0) {
    if (SrcDesc->pBoxes == (BLASBoundingBoxDesc *)0x0) {
      LogError<true,char[45]>
                (false,"CopyBLASGeometryDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0xba,(char (*) [45])"Either pTriangles or pBoxes must not be null");
      return;
    }
    FixedLinearAllocator::AddSpace<Diligent::BLASBoundingBoxDesc_const&>
              (MemPool,(ulong)SrcDesc->BoxCount);
    lVar6 = 0;
    for (uVar8 = 0; uVar8 < SrcDesc->BoxCount; uVar8 = uVar8 + 1) {
      FixedLinearAllocator::AddSpaceForString
                (MemPool,*(Char **)((long)&SrcDesc->pBoxes->GeometryName + lVar6),0);
      lVar6 = lVar6 + 0x10;
    }
    FixedLinearAllocator::Reserve(MemPool);
    pBVar4 = FixedLinearAllocator::
             CopyConstructArray<Diligent::BLASBoundingBoxDesc,Diligent::BLASBoundingBoxDesc>
                       (MemPool,SrcDesc->pBoxes,(ulong)SrcDesc->BoxCount);
    lVar6 = 0;
    p_Var7 = local_68;
    for (uVar8 = 0; uVar1 = SrcDesc->BoxCount, uVar8 < uVar1; uVar8 = uVar8 + 1) {
      GeoName = FixedLinearAllocator::CopyString
                          (MemPool,*(char **)((long)&SrcDesc->pBoxes->GeometryName + lVar6),0);
      *(char **)((long)&pBVar4->GeometryName + lVar6) = GeoName;
      pacVar5 = (char (*) [31])0xffffffffffffffff;
      if (p_Var7 != (_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)0x0) {
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,GeoName,false);
        cVar3 = std::
                _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(p_Var7,(key_type *)&msg);
        HashMapStringKey::Clear((HashMapStringKey *)&msg);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
            ._M_cur == (__node_type *)0x0) {
          FormatString<char[26],char[31]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"iter != pSrcNameToIndex->end()",pacVar5);
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                     "CopyBLASGeometryDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0xaa);
          std::__cxx11::string::~string((string *)&msg);
        }
        pacVar5 = (char (*) [31])
                  (ulong)*(uint *)((long)cVar3.
                                         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                                         ._M_cur + 0x1c);
        p_Var7 = local_68;
      }
      msg._M_dataplus._M_p._0_4_ = (undefined4)uVar8;
      msg._M_dataplus._M_p._4_4_ = SUB84(pacVar5,0);
      pVar9 = std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<char_const*&,Diligent::BLASGeomIndex>(local_58,&GeoName,&msg);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        LogError<true,char[16],char_const*,char[16]>
                  (false,"CopyBLASGeometryDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0xb0,(char (*) [16])"Geometry name \'",&GeoName,
                   (char (*) [16])"\' is not unique");
      }
      lVar6 = lVar6 + 0x10;
    }
    local_60->pBoxes = pBVar4;
    local_60->BoxCount = uVar1;
    local_60->pTriangles = (BLASTriangleDesc *)0x0;
    local_60->TriangleCount = 0;
  }
  else {
    FixedLinearAllocator::AddSpace<Diligent::BLASTriangleDesc_const&>
              (MemPool,(ulong)SrcDesc->TriangleCount);
    lVar6 = 0;
    for (uVar8 = 0; uVar8 < SrcDesc->TriangleCount; uVar8 = uVar8 + 1) {
      FixedLinearAllocator::AddSpaceForString
                (MemPool,*(Char **)((long)&SrcDesc->pTriangles->GeometryName + lVar6),0);
      lVar6 = lVar6 + 0x18;
    }
    FixedLinearAllocator::Reserve(MemPool);
    pBVar2 = FixedLinearAllocator::
             CopyConstructArray<Diligent::BLASTriangleDesc,Diligent::BLASTriangleDesc>
                       (MemPool,SrcDesc->pTriangles,(ulong)SrcDesc->TriangleCount);
    lVar6 = 0;
    p_Var7 = local_68;
    for (uVar8 = 0; uVar1 = SrcDesc->TriangleCount, uVar8 < uVar1; uVar8 = uVar8 + 1) {
      GeoName = FixedLinearAllocator::CopyString
                          (MemPool,*(char **)((long)&SrcDesc->pTriangles->GeometryName + lVar6),0);
      *(char **)((long)&pBVar2->GeometryName + lVar6) = GeoName;
      pacVar5 = (char (*) [31])0xffffffffffffffff;
      if (p_Var7 != (_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)0x0) {
        HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,GeoName,false);
        cVar3 = std::
                _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(p_Var7,(key_type *)&msg);
        HashMapStringKey::Clear((HashMapStringKey *)&msg);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
            ._M_cur == (__node_type *)0x0) {
          FormatString<char[26],char[31]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"iter != pSrcNameToIndex->end()",pacVar5);
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,msg._M_dataplus._M_p._0_4_),
                     "CopyBLASGeometryDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x87);
          std::__cxx11::string::~string((string *)&msg);
        }
        pacVar5 = (char (*) [31])
                  (ulong)*(uint *)((long)cVar3.
                                         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                                         ._M_cur + 0x1c);
        p_Var7 = local_68;
      }
      msg._M_dataplus._M_p._0_4_ = (undefined4)uVar8;
      msg._M_dataplus._M_p._4_4_ = SUB84(pacVar5,0);
      pVar9 = std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<char_const*&,Diligent::BLASGeomIndex>(local_58,&GeoName,&msg);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        LogError<true,char[16],char_const*,char[16]>
                  (false,"CopyBLASGeometryDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x8d,(char (*) [16])"Geometry name \'",&GeoName,
                   (char (*) [16])"\' is not unique");
      }
      lVar6 = lVar6 + 0x18;
    }
    local_60->pTriangles = pBVar2;
    local_60->TriangleCount = uVar1;
    local_60->pBoxes = (BLASBoundingBoxDesc *)0x0;
    local_60->BoxCount = 0;
  }
  return;
}

Assistant:

void CopyBLASGeometryDesc(const BottomLevelASDesc& SrcDesc,
                          BottomLevelASDesc&       DstDesc,
                          FixedLinearAllocator&    MemPool,
                          const BLASNameToIndex*   pSrcNameToIndex,
                          BLASNameToIndex&         DstNameToIndex) noexcept(false)
{
    if (SrcDesc.pTriangles != nullptr)
    {
        MemPool.AddSpace<decltype(*SrcDesc.pTriangles)>(SrcDesc.TriangleCount);

        for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
            MemPool.AddSpaceForString(SrcDesc.pTriangles[i].GeometryName);

        MemPool.Reserve();

        BLASTriangleDesc* pTriangles = MemPool.CopyArray(SrcDesc.pTriangles, SrcDesc.TriangleCount);

        // Copy strings
        for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
        {
            const char* GeoName        = MemPool.CopyString(SrcDesc.pTriangles[i].GeometryName);
            pTriangles[i].GeometryName = GeoName;

            Uint32 ActualIndex = INVALID_INDEX;
            if (pSrcNameToIndex)
            {
                auto iter = pSrcNameToIndex->find(GeoName);
                VERIFY_EXPR(iter != pSrcNameToIndex->end());
                ActualIndex = iter->second.ActualIndex;
            }

            bool IsUniqueName = DstNameToIndex.emplace(GeoName, BLASGeomIndex{i, ActualIndex}).second;
            if (!IsUniqueName)
                LOG_ERROR_AND_THROW("Geometry name '", GeoName, "' is not unique");
        }

        DstDesc.pTriangles    = pTriangles;
        DstDesc.TriangleCount = SrcDesc.TriangleCount;
        DstDesc.pBoxes        = nullptr;
        DstDesc.BoxCount      = 0;
    }
    else if (SrcDesc.pBoxes != nullptr)
    {
        MemPool.AddSpace<decltype(*SrcDesc.pBoxes)>(SrcDesc.BoxCount);

        for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
            MemPool.AddSpaceForString(SrcDesc.pBoxes[i].GeometryName);

        MemPool.Reserve();

        BLASBoundingBoxDesc* pBoxes = MemPool.CopyArray(SrcDesc.pBoxes, SrcDesc.BoxCount);

        // Copy strings
        for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
        {
            const char* GeoName    = MemPool.CopyString(SrcDesc.pBoxes[i].GeometryName);
            pBoxes[i].GeometryName = GeoName;

            Uint32 ActualIndex = INVALID_INDEX;
            if (pSrcNameToIndex)
            {
                auto iter = pSrcNameToIndex->find(GeoName);
                VERIFY_EXPR(iter != pSrcNameToIndex->end());
                ActualIndex = iter->second.ActualIndex;
            }

            bool IsUniqueName = DstNameToIndex.emplace(GeoName, BLASGeomIndex{i, ActualIndex}).second;
            if (!IsUniqueName)
                LOG_ERROR_AND_THROW("Geometry name '", GeoName, "' is not unique");
        }

        DstDesc.pBoxes        = pBoxes;
        DstDesc.BoxCount      = SrcDesc.BoxCount;
        DstDesc.pTriangles    = nullptr;
        DstDesc.TriangleCount = 0;
    }
    else
    {
        LOG_ERROR_AND_THROW("Either pTriangles or pBoxes must not be null");
    }
}